

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

void __thiscall
cmCTestSubmitHandler::ResponseParser::StartElement(ResponseParser *this,string *name,char **atts)

{
  pointer pcVar1;
  char *pcVar2;
  int iVar3;
  char *__s;
  
  pcVar1 = (this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->CurrentValue).super__Vector_base<char,_std::allocator<char>_>._M_impl.
    super__Vector_impl_data._M_finish = pcVar1;
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  if (iVar3 != 0) {
    return;
  }
  __s = cmXMLParser::FindAttribute(atts,"version");
  pcVar2 = (char *)(this->CDashVersion)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&this->CDashVersion,0,pcVar2,(ulong)__s);
  return;
}

Assistant:

virtual void StartElement(const std::string& name, const char** atts)
    {
    this->CurrentValue.clear();
    if(name == "cdash")
      {
      this->CDashVersion = this->FindAttribute(atts, "version");
      }
    }